

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_promise_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  JSRuntime *pJVar1;
  JSValue v;
  int iVar2;
  JSValueUnion JVar3;
  undefined4 *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  JSValue promise;
  JSValue JVar8;
  JSValue v_00;
  JSValue args [2];
  JSValue error;
  
  JVar8 = *argv;
  iVar2 = check_function(ctx,*argv);
  if (iVar2 == 0) {
    promise = js_create_from_ctor(ctx,new_target,0x2a);
    uVar7 = promise.tag;
    JVar3 = promise.u;
    if ((uVar7 & 0xffffffff) != 6) {
      puVar4 = (undefined4 *)js_mallocz(ctx,0x40);
      if (puVar4 != (undefined4 *)0x0) {
        *puVar4 = 0;
        puVar4[10] = 0;
        *(undefined4 **)(puVar4 + 2) = puVar4 + 2;
        *(undefined4 **)(puVar4 + 4) = puVar4 + 2;
        *(undefined4 **)(puVar4 + 6) = puVar4 + 6;
        *(undefined4 **)(puVar4 + 8) = puVar4 + 6;
        puVar4[0xc] = 0;
        *(undefined8 *)(puVar4 + 0xe) = 3;
        if ((int)promise.tag == -1) {
          *(undefined4 **)((long)JVar3.ptr + 0x30) = puVar4;
        }
        iVar2 = js_create_resolving_functions(ctx,args,promise);
        if (iVar2 == 0) {
          JVar8 = JS_Call(ctx,JVar8,(JSValue)(ZEXT816(3) << 0x40),2,args);
          if ((int)JVar8.tag == 6) {
            pJVar1 = ctx->rt;
            error.u = (pJVar1->current_exception).u;
            error.tag = (pJVar1->current_exception).tag;
            (pJVar1->current_exception).u.int32 = 0;
            (pJVar1->current_exception).tag = 2;
            v_00 = JS_Call(ctx,args[1],(JSValue)(ZEXT816(3) << 0x40),1,&error);
            v.tag = error.tag;
            v.u.float64 = error.u.float64;
            JS_FreeValue(ctx,v);
            if ((int)v_00.tag == 6) {
              JS_FreeValue(ctx,args[0]);
              JS_FreeValue(ctx,args[1]);
              goto LAB_0012a88a;
            }
            JS_FreeValue(ctx,v_00);
          }
          JS_FreeValue(ctx,JVar8);
          JS_FreeValue(ctx,args[0]);
          JS_FreeValue(ctx,args[1]);
          uVar6 = (ulong)JVar3.ptr & 0xffffffff00000000;
          uVar5 = (ulong)JVar3.ptr & 0xffffffff;
          goto LAB_0012a89e;
        }
      }
LAB_0012a88a:
      JS_FreeValue(ctx,promise);
    }
  }
  uVar5 = 0;
  uVar6 = 0;
  uVar7 = 6;
LAB_0012a89e:
  JVar8.u.ptr = (void *)(uVar5 | uVar6);
  JVar8.tag = uVar7;
  return JVar8;
}

Assistant:

static JSValue js_promise_constructor(JSContext *ctx, JSValueConst new_target,
                                      int argc, JSValueConst *argv)
{
    JSValueConst executor;
    JSValue obj;
    JSPromiseData *s;
    JSValue args[2], ret;
    int i;

    executor = argv[0];
    if (check_function(ctx, executor))
        return JS_EXCEPTION;
    obj = js_create_from_ctor(ctx, new_target, JS_CLASS_PROMISE);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    s = js_mallocz(ctx, sizeof(*s));
    if (!s)
        goto fail;
    s->promise_state = JS_PROMISE_PENDING;
    s->is_handled = FALSE;
    for(i = 0; i < 2; i++)
        init_list_head(&s->promise_reactions[i]);
    s->promise_result = JS_UNDEFINED;
    JS_SetOpaque(obj, s);
    if (js_create_resolving_functions(ctx, args, obj))
        goto fail;
    ret = JS_Call(ctx, executor, JS_UNDEFINED, 2, (JSValueConst *)args);
    if (JS_IsException(ret)) {
        JSValue ret2, error;
        error = JS_GetException(ctx);
        ret2 = JS_Call(ctx, args[1], JS_UNDEFINED, 1, (JSValueConst *)&error);
        JS_FreeValue(ctx, error);
        if (JS_IsException(ret2))
            goto fail1;
        JS_FreeValue(ctx, ret2);
    }
    JS_FreeValue(ctx, ret);
    JS_FreeValue(ctx, args[0]);
    JS_FreeValue(ctx, args[1]);
    return obj;
 fail1:
    JS_FreeValue(ctx, args[0]);
    JS_FreeValue(ctx, args[1]);
 fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}